

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O3

StringTree * __thiscall
kj::strTree<char_const*&,char_const(&)[7],kj::String&,char,kj::String&,char_const(&)[3]>
          (StringTree *__return_storage_ptr__,kj *this,char **params,char (*params_1) [7],
          String *params_2,char *params_3,String *params_4,char (*params_5) [3])

{
  char *__s;
  long lVar1;
  Branch *pBVar2;
  ArrayPtr<const_char> *in_stack_ffffffffffffff70;
  undefined1 local_81 [9];
  undefined1 *local_78;
  ArrayPtr<const_char> local_70;
  char *local_60;
  char *local_58;
  ArrayPtr<const_char> local_50;
  Branch *local_40;
  undefined1 *local_38;
  
  __s = *(char **)this;
  local_58 = (char *)strlen(__s);
  local_60 = __s;
  local_70.size_ = strlen((char *)params);
  lVar1 = *(long *)(params_1[1] + 1);
  local_81._1_8_ = lVar1;
  if (lVar1 != 0) {
    local_81._1_8_ = *(undefined8 *)params_1;
  }
  local_78 = (undefined1 *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_78 = (undefined1 *)0x0;
  }
  local_81[0] = *(undefined1 *)&(params_2->content).ptr;
  pBVar2 = *(Branch **)(params_3 + 8);
  local_40 = pBVar2;
  if (pBVar2 != (Branch *)0x0) {
    local_40 = *(Branch **)params_3;
  }
  local_38 = (undefined1 *)((long)&pBVar2[-1].content.branches.disposer + 7);
  if (pBVar2 == (Branch *)0x0) {
    local_38 = (undefined1 *)0x0;
  }
  local_70.ptr = (char *)params;
  local_50.size_ = strlen((char *)params_4);
  local_50.ptr = (char *)params_4;
  StringTree::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_60,&local_70,
             (ArrayPtr<const_char> *)(local_81 + 1),(ArrayPtr<const_char> *)local_81,
             (FixedArray<char,_1UL> *)&local_40,&local_50,in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}